

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkNodeDup(Abc_Ntk_t *pNtkInit,int nLimit,int fVerbose)

{
  uint uVar1;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  uint *__ptr;
  void *pvVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  Abc_Obj_t *pObj_00;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  
  pNtkNew = Abc_NtkDup(pNtkInit);
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar2 = malloc(800);
  *(void **)(__ptr + 2) = pvVar2;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vNodes->pArray = ppvVar3;
  do {
    pVVar4 = pNtkNew->vObjs;
    uVar7 = 0;
    if (0 < pVVar4->nSize) {
      lVar9 = 0;
      uVar7 = 0;
      do {
        pvVar2 = pVVar4->pArray[lVar9];
        if (((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) &&
           (nLimit <= *(int *)((long)pvVar2 + 0x2c))) {
          uVar1 = *__ptr;
          if (uVar7 == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar5 = malloc(0x80);
              }
              else {
                pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
              }
              uVar8 = 0x10;
            }
            else {
              uVar8 = uVar1 * 2;
              if ((int)uVar8 <= (int)uVar1) goto LAB_008639b2;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar5 = malloc((ulong)uVar1 << 4);
              }
              else {
                pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar1 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar5;
            *__ptr = uVar8;
          }
LAB_008639b2:
          lVar6 = (long)(int)uVar7;
          uVar7 = uVar7 + 1;
          *(void **)(*(long *)(__ptr + 2) + lVar6 * 8) = pvVar2;
        }
        lVar9 = lVar9 + 1;
        pVVar4 = pNtkNew->vObjs;
      } while (lVar9 < pVVar4->nSize);
    }
    if (0 < (int)uVar7) {
      lVar9 = *(long *)(__ptr + 2);
      uVar10 = 0;
      do {
        pObj = *(Abc_Obj_t **)(lVar9 + uVar10 * 8);
        pObj_00 = Abc_NtkDupObj(pNtkNew,pObj,0);
        if (0 < (pObj->vFanins).nSize) {
          lVar6 = 0;
          do {
            Abc_ObjAddFanin(pObj_00,(Abc_Obj_t *)
                                    pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]]);
            lVar6 = lVar6 + 1;
          } while (lVar6 < (pObj->vFanins).nSize);
        }
        Abc_NodeCollectFanouts(pObj,vNodes);
        if (vNodes->nSize < nLimit / 2) {
          __ptr[1] = uVar7;
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
        }
        vNodes->nSize = nLimit / 2;
        if (1 < nLimit) {
          lVar6 = 0;
          do {
            Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[lVar6],pObj,pObj_00);
            lVar6 = lVar6 + 1;
          } while (lVar6 < vNodes->nSize);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar7);
    }
    if (fVerbose != 0) {
      printf("Duplicated %d nodes.\n",(ulong)uVar7);
    }
    if ((int)uVar7 < 1) {
      __ptr[1] = uVar7;
      if (vNodes->pArray != (void **)0x0) {
        free(vNodes->pArray);
        vNodes->pArray = (void **)0x0;
      }
      free(vNodes);
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      return pNtkNew;
    }
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkNodeDup( Abc_Ntk_t * pNtkInit, int nLimit, int fVerbose )
{
    Vec_Ptr_t * vNodes, * vFanouts;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj, * pObjNew, * pFanin, * pFanout;
    int i, k;
    pNtk = Abc_NtkDup( pNtkInit );
    vNodes = Vec_PtrAlloc( 100 );
    vFanouts = Vec_PtrAlloc( 100 );
    do
    {
        Vec_PtrClear( vNodes );
        Abc_NtkForEachNode( pNtk, pObj, i )
            if ( Abc_ObjFanoutNum(pObj) >= nLimit )
                Vec_PtrPush( vNodes, pObj );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        {
            pObjNew = Abc_NtkDupObj( pNtk, pObj, 0 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObjNew, pFanin );
            Abc_NodeCollectFanouts( pObj, vFanouts );
            Vec_PtrShrink( vFanouts, nLimit / 2 );
            Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, k )
                Abc_ObjPatchFanin( pFanout, pObj, pObjNew );
        }
        if ( fVerbose )
            printf( "Duplicated %d nodes.\n", Vec_PtrSize(vNodes) );
    }
    while ( Vec_PtrSize(vNodes) > 0 );
    Vec_PtrFree( vFanouts );
    Vec_PtrFree( vNodes );
    return pNtk;
}